

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

void __thiscall
Assimp::FBXExporter::FBXExporter(FBXExporter *this,aiScene *pScene,ExportProperties *pProperties)

{
  ExportProperties *pProperties_local;
  aiScene *pScene_local;
  FBXExporter *this_local;
  
  this->binary = false;
  this->mScene = pScene;
  this->mProperties = pProperties;
  std::shared_ptr<Assimp::IOStream>::shared_ptr(&this->outfile);
  memset(&this->connections,0,0x18);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::vector(&this->connections);
  memset(&this->mesh_uids,0,0x18);
  std::vector<long,_std::allocator<long>_>::vector(&this->mesh_uids);
  memset(&this->material_uids,0,0x18);
  std::vector<long,_std::allocator<long>_>::vector(&this->material_uids);
  memset(&this->node_uids,0,0x30);
  std::
  map<const_aiNode_*,_long,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_long>_>_>
  ::map(&this->node_uids);
  this->last_uid = 999999;
  return;
}

Assistant:

FBXExporter::FBXExporter ( const aiScene* pScene, const ExportProperties* pProperties )
: binary(false)
, mScene(pScene)
, mProperties(pProperties)
, outfile()
, connections()
, mesh_uids()
, material_uids()
, node_uids() {
    // will probably need to determine UIDs, connections, etc here.
    // basically anything that needs to be known
    // before we start writing sections to the stream.
}